

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

action Search::choose_oracle_action
                 (search_private *priv,size_t ec_cnt,action *oracle_actions,
                 size_t oracle_actions_cnt,action *allowed_actions,size_t allowed_actions_cnt,
                 float *allowed_actions_cost)

{
  ulong uVar1;
  wclass *pwVar2;
  size_t sVar3;
  ulong uVar4;
  v_array<Search::action_cache> *this;
  polylabel *ppVar5;
  size_t sVar6;
  uint32_t uVar7;
  uint64_t *initial;
  long lVar8;
  size_t k;
  long lVar9;
  float fVar10;
  float fVar11;
  v_array<Search::action_cache> *this_cache;
  action_cache local_58;
  size_t local_48;
  size_t local_40;
  v_array<Search::action_cache> *local_38;
  
  local_40 = ec_cnt;
  if (priv->use_action_costs == true) {
    sVar6 = allowed_actions_cnt;
    if (allowed_actions == (action *)0x0) {
      sVar6 = priv->A;
    }
    if (sVar6 != 0) {
      fVar11 = 3.4028235e+38;
      sVar3 = 0;
      do {
        fVar10 = allowed_actions_cost[sVar3];
        if (fVar11 <= allowed_actions_cost[sVar3]) {
          fVar10 = fVar11;
        }
        fVar11 = fVar10;
        sVar3 = sVar3 + 1;
      } while (sVar6 != sVar3);
      if (fVar11 < 3.4028235e+38) {
        uVar7 = 0xffffffff;
        sVar3 = 0;
        uVar4 = 0;
        local_48 = allowed_actions_cnt;
        do {
          if ((allowed_actions_cost[sVar3] <= fVar11) &&
             ((uVar1 = uVar4 + 1, uVar4 == 0 ||
              (fVar10 = merand48(&priv->all->random_state), uVar4 = uVar1,
              fVar10 < 1.0 / (float)uVar1)))) {
            if (allowed_actions == (action *)0x0) {
              uVar7 = (int)sVar3 + 1;
              uVar4 = uVar1;
            }
            else {
              uVar7 = allowed_actions[sVar3];
              uVar4 = uVar1;
            }
          }
          sVar3 = sVar3 + 1;
        } while (sVar6 != sVar3);
        allowed_actions_cnt = local_48;
        if (uVar7 != 0xffffffff) goto LAB_002682e3;
      }
    }
  }
  if ((priv->perturb_oracle <= 0.0) || (priv->state != INIT_TRAIN)) {
    if (oracle_actions_cnt != 0) goto LAB_002681a1;
  }
  else {
    fVar11 = merand48(&priv->all->random_state);
    if ((oracle_actions_cnt != 0) && (priv->perturb_oracle <= fVar11)) {
LAB_002681a1:
      fVar11 = merand48(&priv->all->random_state);
      uVar4 = (ulong)(fVar11 * (float)oracle_actions_cnt);
      uVar7 = oracle_actions
              [(long)(fVar11 * (float)oracle_actions_cnt - 9.223372e+18) & (long)uVar4 >> 0x3f |
               uVar4];
      goto LAB_002682e3;
    }
  }
  if (allowed_actions_cnt == 0) {
    initial = &priv->all->random_state;
    if (priv->is_ldf != true) {
      uVar4 = priv->A;
      fVar11 = merand48(initial);
      fVar11 = fVar11 * (float)uVar4;
      lVar9 = (long)fVar11;
      uVar7 = ((uint)lVar9 | (uint)(long)(fVar11 - 9.223372e+18) & (uint)(lVar9 >> 0x3f)) + 1;
      oracle_actions_cnt = 0;
      goto LAB_002682e3;
    }
    fVar11 = merand48(initial);
    lVar9 = (long)(fVar11 * (float)local_40);
    uVar7 = (uint)lVar9 |
            (uint)(long)(fVar11 * (float)local_40 - 9.223372e+18) & (uint)(lVar9 >> 0x3f);
  }
  else {
    fVar11 = merand48(&priv->all->random_state);
    uVar4 = (ulong)(fVar11 * (float)allowed_actions_cnt);
    uVar7 = allowed_actions
            [(long)(fVar11 * (float)allowed_actions_cnt - 9.223372e+18) & (long)uVar4 >> 0x3f |
             uVar4];
  }
  oracle_actions_cnt = 0;
LAB_002682e3:
  if (((priv->state == INIT_TRAIN) && (priv->metatask != (search_metatask *)0x0)) &&
     (priv->metaoverride != (BaseTask *)0x0)) {
    this = (v_array<Search::action_cache> *)operator_new(0x20);
    this->_begin = (action_cache *)0x0;
    this->_end = (action_cache *)0x0;
    this->end_array = (action_cache *)0x0;
    this->erase_count = 0;
    local_38 = this;
    ppVar5 = allowed_actions_to_ld(priv,1,allowed_actions,allowed_actions_cnt,allowed_actions_cost);
    pwVar2 = (ppVar5->cs).costs._begin;
    lVar9 = (long)(ppVar5->cs).costs._end - (long)pwVar2;
    if (lVar9 != 0) {
      lVar9 = lVar9 >> 4;
      lVar8 = 0;
      do {
        local_58.k = pwVar2[lVar8].class_index;
        local_58.cost = 1.0;
        if (oracle_actions_cnt != 0 && oracle_actions != (action *)0x0) {
          sVar6 = 0;
          do {
            if (oracle_actions[sVar6] == local_58.k) {
              local_58.cost = 0.0;
              goto LAB_002683ac;
            }
            sVar6 = sVar6 + 1;
          } while (oracle_actions_cnt != sVar6);
          local_58.cost = 1.0;
        }
LAB_002683ac:
        local_58.is_opt = local_58.k == uVar7;
        local_58.min_cost = 0.0;
        v_array<Search::action_cache>::push_back(this,&local_58);
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar9 + (ulong)(lVar9 == 0));
    }
    v_array<v_array<Search::action_cache>_*>::push_back(&priv->memo_foreach_action,&local_38);
  }
  return uVar7;
}

Assistant:

action choose_oracle_action(search_private& priv, size_t ec_cnt, const action* oracle_actions,
    size_t oracle_actions_cnt, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost)
{
  action a = (action)-1;
  if (priv.use_action_costs)
  {
    size_t K = (allowed_actions == nullptr) ? priv.A : allowed_actions_cnt;
    cdbg << "costs = [";
    for (size_t k = 0; k < K; k++) cdbg << ' ' << allowed_actions_cost[k];
    cdbg << " ]" << endl;
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++) min_cost = min(min_cost, allowed_actions_cost[k]);
    cdbg << "min_cost = " << min_cost;
    if (min_cost < FLT_MAX)
    {
      size_t count = 0;
      for (size_t k = 0; k < K; k++)
        if (allowed_actions_cost[k] <= min_cost)
        {
          cdbg << ", hit @ " << k;
          count++;
          if ((count == 1) || (merand48(priv.all->random_state) < 1. / (float)count))
          {
            a = (allowed_actions == nullptr) ? (uint32_t)(k + 1) : allowed_actions[k];
            cdbg << "***";
          }
        }
    }
    cdbg << endl;
  }

  if (a == (action)-1)
  {
    if ((priv.perturb_oracle > 0.) && (priv.state == INIT_TRAIN) &&
        (merand48(priv.all->random_state) < priv.perturb_oracle))
      oracle_actions_cnt = 0;
    a = (oracle_actions_cnt > 0)
        ? oracle_actions[random(priv.all->random_state, oracle_actions_cnt)]
        : (allowed_actions_cnt > 0) ? allowed_actions[random(priv.all->random_state, allowed_actions_cnt)]
                                    : priv.is_ldf ? (action)random(priv.all->random_state, ec_cnt)
                                                  : (action)(1 + random(priv.all->random_state, priv.A));
  }
  cdbg << "choose_oracle_action from oracle_actions = [";
  for (size_t i = 0; i < oracle_actions_cnt; i++) cdbg << " " << oracle_actions[i];
  cdbg << " ], ret=" << a << endl;
  if (need_memo_foreach_action(priv) && (priv.state == INIT_TRAIN))
  {
    v_array<action_cache>* this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
    // TODO we don't really need to construct this polylabel
    polylabel l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
    size_t K = cs_get_costs_size(priv.cb_learner, l);
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, l, k);
      float cost = array_contains(cl, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f;
      this_cache->push_back(action_cache(0., cl, cl == a, cost));
    }
    assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
    priv.memo_foreach_action.push_back(this_cache);
    cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << " from oracle" << endl;
  }
  return a;
}